

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void Z80::OpCode_Next_SETBRK(void)

{
  byte bVar1;
  bool bVar2;
  word wVar3;
  word wVar4;
  bool in_SIL;
  char **ppcVar5;
  int e [4];
  int local_28 [6];
  
  if (DAT_0018e51c < 2) {
    Error("[SETBRK] fake instruction \"setbrk\" must be specifically enabled by --zxnext=cspect option"
          ,(char *)0x0,PASS3);
    SkipToEol(&lp);
    return;
  }
  local_28[0] = 0xed;
  local_28[1] = 1;
  local_28[2] = -1;
  local_28[3] = -1;
  bVar1 = GetByte((char **)0x0,in_SIL);
  local_28[2] = (uint)bVar1;
  ppcVar5 = &lp;
  bVar2 = comma(&lp);
  if (bVar2) {
    wVar3 = GetWord(ppcVar5);
    ppcVar5 = &lp;
    bVar2 = comma(&lp);
    if (bVar2) {
      wVar4 = GetWord(ppcVar5);
      EmitBytes(local_28,true);
      EmitWord((uint)wVar3,false);
      EmitWord((uint)wVar4,false);
      return;
    }
  }
  Error("[SETBRK] syntax: SETBRK <type>, <start_address>, <end_address>",(char *)0x0,PASS3);
  return;
}

Assistant:

static void OpCode_Next_SETBRK() {	// this is fake instruction for CSpect emulator, not for real Z80N
		if (Options::syx.IsNextEnabled < 2) {
			Error("[SETBRK] fake instruction \"setbrk\" must be specifically enabled by --zxnext=cspect option");
			SkipToEol(lp);
			return;
		}
		int e[] { 0xED, 0x01, -1, -1 };
		e[2] = GetByte(lp);						// type
		if (comma(lp)) {
			word startad = GetWord(lp);			// start address
			if (comma(lp)) {
				word endad = GetWord(lp);		// end address
				EmitBytes(e, true);
				EmitWord(startad);
				EmitWord(endad);
				return;
			}
		}
		Error("[SETBRK] syntax: SETBRK <type>, <start_address>, <end_address>");
	}